

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O0

int JacVI(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp1)

{
  double dVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *flagvalue;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  sunindextype i;
  sunrealtype *Jw_v;
  sunrealtype *Jv_v;
  sunrealtype *Ju_v;
  sunrealtype *v_w;
  sunrealtype *v_v;
  sunrealtype *v_u;
  sunrealtype *y_w;
  sunrealtype *y_v;
  sunrealtype *y_u;
  sunrealtype ep;
  sunindextype N;
  UserData userdata;
  undefined8 in_stack_ffffffffffffff58;
  int opt;
  long lVar12;
  char *pcVar13;
  void *flagvalue_00;
  int local_4;
  
  lVar2 = *in_R8;
  dVar1 = (double)in_R8[7];
  flagvalue_00 = (void *)0x0;
  pcVar13 = (char *)0x0;
  uVar4 = N_VGetSubvector_ManyVector(in_RDX,0);
  lVar5 = N_VGetArrayPointer(uVar4);
  opt = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  iVar3 = check_flag(flagvalue_00,pcVar13,opt);
  if (iVar3 == 0) {
    uVar4 = N_VGetSubvector_ManyVector(in_RDX,1);
    lVar6 = N_VGetArrayPointer(uVar4);
    iVar3 = check_flag(flagvalue_00,pcVar13,opt);
    if (iVar3 == 0) {
      uVar4 = N_VGetSubvector_ManyVector(in_RDX,2);
      lVar7 = N_VGetArrayPointer(uVar4);
      iVar3 = check_flag(flagvalue_00,pcVar13,opt);
      if (iVar3 == 0) {
        uVar4 = N_VGetSubvector_ManyVector(in_RDI,0);
        lVar8 = N_VGetArrayPointer(uVar4);
        iVar3 = check_flag(flagvalue_00,pcVar13,opt);
        if (iVar3 == 0) {
          uVar4 = N_VGetSubvector_ManyVector(in_RDI,1);
          lVar9 = N_VGetArrayPointer(uVar4);
          iVar3 = check_flag(flagvalue_00,pcVar13,opt);
          if (iVar3 == 0) {
            uVar4 = N_VGetSubvector_ManyVector(in_RDI,2);
            lVar10 = N_VGetArrayPointer(uVar4);
            iVar3 = check_flag(flagvalue_00,pcVar13,opt);
            if (iVar3 == 0) {
              uVar4 = N_VGetSubvector_ManyVector(in_RSI,0);
              puVar11 = (undefined8 *)N_VGetArrayPointer(uVar4);
              iVar3 = check_flag(flagvalue_00,pcVar13,opt);
              if (iVar3 == 0) {
                uVar4 = N_VGetSubvector_ManyVector(in_RSI,1);
                flagvalue = (undefined8 *)N_VGetArrayPointer(uVar4);
                iVar3 = check_flag(flagvalue,pcVar13,opt);
                if (iVar3 == 0) {
                  uVar4 = N_VGetSubvector_ManyVector(in_RSI,2);
                  pcVar13 = (char *)N_VGetArrayPointer(uVar4);
                  iVar3 = check_flag(flagvalue,pcVar13,opt);
                  if (iVar3 == 0) {
                    N_VConst(in_RSI);
                    for (lVar12 = 1; lVar12 < lVar2 + -1; lVar12 = lVar12 + 1) {
                      puVar11[lVar12] =
                           *(double *)(lVar6 + lVar12 * 8) * 2.0 * *(double *)(lVar5 + lVar12 * 8) *
                           *(double *)(lVar8 + lVar12 * 8) +
                           *(double *)(lVar9 + lVar12 * 8) * *(double *)(lVar5 + lVar12 * 8) *
                           *(double *)(lVar5 + lVar12 * 8) +
                           ((-*(double *)(lVar10 + lVar12 * 8) * *(double *)(lVar5 + lVar12 * 8) +
                            -(*(double *)(lVar7 + lVar12 * 8) * *(double *)(lVar8 + lVar12 * 8))) -
                           *(double *)(lVar8 + lVar12 * 8));
                      flagvalue[lVar12] =
                           -(*(double *)(lVar6 + lVar12 * 8) * 2.0 * *(double *)(lVar5 + lVar12 * 8)
                            ) * *(double *)(lVar8 + lVar12 * 8) +
                           -(*(double *)(lVar9 + lVar12 * 8) * *(double *)(lVar5 + lVar12 * 8)) *
                           *(double *)(lVar5 + lVar12 * 8) +
                           *(double *)(lVar10 + lVar12 * 8) * *(double *)(lVar5 + lVar12 * 8) +
                           *(double *)(lVar7 + lVar12 * 8) * *(double *)(lVar8 + lVar12 * 8);
                      *(double *)(pcVar13 + lVar12 * 8) =
                           -*(double *)(lVar7 + lVar12 * 8) * *(double *)(lVar8 + lVar12 * 8) +
                           -*(double *)(lVar10 + lVar12 * 8) * *(double *)(lVar5 + lVar12 * 8) +
                           -*(double *)(lVar10 + lVar12 * 8) / dVar1;
                    }
                    pcVar13[0] = '\0';
                    pcVar13[1] = '\0';
                    pcVar13[2] = '\0';
                    pcVar13[3] = '\0';
                    pcVar13[4] = '\0';
                    pcVar13[5] = '\0';
                    pcVar13[6] = '\0';
                    pcVar13[7] = '\0';
                    *flagvalue = 0;
                    *puVar11 = 0;
                    pcVar13 = pcVar13 + (lVar2 + -1) * 8;
                    pcVar13[0] = '\0';
                    pcVar13[1] = '\0';
                    pcVar13[2] = '\0';
                    pcVar13[3] = '\0';
                    pcVar13[4] = '\0';
                    pcVar13[5] = '\0';
                    pcVar13[6] = '\0';
                    pcVar13[7] = '\0';
                    flagvalue[lVar2 + -1] = 0;
                    puVar11[lVar2 + -1] = 0;
                    local_4 = 0;
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int JacVI(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* user_data, N_Vector tmp1)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *v_u = NULL, *v_v = NULL, *v_w = NULL;
  sunrealtype *Ju_v = NULL, *Jv_v = NULL, *Jw_v = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  v_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 0));
  if (check_flag((void*)v_u, "N_VGetArrayPointer", 0)) { return 1; }
  v_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 1));
  if (check_flag((void*)v_v, "N_VGetArrayPointer", 0)) { return 1; }
  v_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 2));
  if (check_flag((void*)v_w, "N_VGetArrayPointer", 0)) { return 1; }

  Ju_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 0));
  if (check_flag((void*)Ju_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jv_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 1));
  if (check_flag((void*)Jv_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jw_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 2));
  if (check_flag((void*)Jw_v, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(ZERO, Jv); /* initialize Jv to zero */

  /* iterate over domain, computing Jacobian-vector products */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in Jacobian-vector product for Ju*v */
    Ju_v[i] = -v_w[i] * y_u[i] - y_w[i] * v_u[i] - v_u[i] +
              v_v[i] * y_u[i] * y_u[i] + TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jv*v */
    Jv_v[i] = v_w[i] * y_u[i] + y_w[i] * v_u[i] - v_v[i] * y_u[i] * y_u[i] -
              TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jw*v */
    Jw_v[i] = -v_w[i] / ep - v_w[i] * y_u[i] - y_w[i] * v_u[i];
  }

  /* enforce stationary boundaries */
  Ju_v[0] = Jv_v[0] = Jw_v[0] = ZERO;
  Ju_v[N - 1] = Jv_v[N - 1] = Jw_v[N - 1] = ZERO;

  return 0; /* Return with success */
}